

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_quad_mesh.h
# Opt level: O1

PrimInfoMB * __thiscall
embree::sse2::QuadMeshISA::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,QuadMeshISA *this,mvector<PrimRefMB> *prims,
          BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  BBox1f BVar2;
  BufferView<embree::Vec3fa> *pBVar3;
  char *pcVar4;
  size_t sVar5;
  PrimRefMB *pPVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  size_t sVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  size_t *psVar18;
  char *pcVar19;
  undefined4 uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  size_t sVar24;
  bool bVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  float fVar31;
  float fVar34;
  float fVar35;
  undefined1 auVar32 [12];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar33;
  float fVar36;
  float fVar37;
  float fVar42;
  undefined1 auVar38 [12];
  float fVar41;
  undefined1 auVar39 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar40;
  float fVar43;
  float fVar44;
  undefined1 auVar45 [12];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar46;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar47;
  undefined1 auVar48 [12];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar49;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar50;
  float fVar51;
  float fVar55;
  float fVar56;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar57;
  float fVar59;
  float fVar60;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar58;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float local_100;
  float local_fc;
  unsigned_long local_e0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_d8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_c8;
  BBox1f local_b8;
  
  local_c8 = _DAT_01feb9f0;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = _DAT_01feb9f0;
  local_d8 = _DAT_01feba00;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = _DAT_01feba00;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = local_c8;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = local_d8;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = local_c8;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = local_d8;
  (__return_storage_ptr__->object_range)._begin = 0;
  (__return_storage_ptr__->object_range)._end = 0;
  (__return_storage_ptr__->max_time_range).lower = 0.0;
  __return_storage_ptr__->num_time_segments = 0;
  __return_storage_ptr__->max_num_time_segments = 0;
  *(undefined1 **)&(__return_storage_ptr__->max_time_range).upper = &DAT_3f8000003f800000;
  (__return_storage_ptr__->time_range).upper = 0.0;
  uVar22 = r->_begin;
  local_100 = (__return_storage_ptr__->time_range).lower;
  local_fc = 0.0;
  sVar11 = __return_storage_ptr__->num_time_segments;
  uVar23 = __return_storage_ptr__->max_num_time_segments;
  local_b8 = __return_storage_ptr__->max_time_range;
  aVar47 = local_d8;
  aVar50 = local_c8;
  aVar58 = local_d8;
  aVar61 = local_c8;
  if (uVar22 < r->_end) {
    local_e0 = (__return_storage_ptr__->object_range)._end;
    do {
      BVar2 = (this->super_QuadMesh).super_Geometry.time_range;
      fVar43 = (this->super_QuadMesh).super_Geometry.fnumTimeSegments;
      fVar29 = t0t1->lower;
      fVar28 = t0t1->upper;
      fVar27 = BVar2.lower;
      fVar36 = BVar2.upper - fVar27;
      fVar26 = floorf(((fVar29 - fVar27) / fVar36) * 1.0000002 * fVar43);
      fVar27 = ceilf(((fVar28 - fVar27) / fVar36) * 0.99999976 * fVar43);
      lVar21 = *(long *)&(this->super_QuadMesh).super_Geometry.field_0x58;
      lVar12 = *(long *)&(this->super_QuadMesh).field_0x68 * uVar22;
      uVar8 = (ulong)*(uint *)(lVar21 + lVar12);
      pBVar3 = (this->super_QuadMesh).vertices.items;
      uVar15 = (pBVar3->super_RawBufferView).num;
      if ((((uVar8 < uVar15) && (uVar9 = (ulong)*(uint *)(lVar21 + 4 + lVar12), uVar9 < uVar15)) &&
          (uVar10 = (ulong)*(uint *)(lVar21 + 8 + lVar12), uVar10 < uVar15)) &&
         (uVar13 = (ulong)*(uint *)(lVar21 + 0xc + lVar12), uVar13 < uVar15)) {
        fVar36 = 0.0;
        if (0.0 <= fVar26) {
          fVar36 = fVar26;
        }
        uVar14 = (uint)fVar36;
        if (fVar43 <= fVar27) {
          fVar27 = fVar43;
        }
        uVar17 = (uint)fVar27;
        bVar25 = uVar17 < uVar14;
        if (uVar14 <= uVar17) {
          uVar15 = (ulong)(int)uVar14;
          pcVar19 = pBVar3[uVar15].super_RawBufferView.ptr_ofs;
          sVar24 = pBVar3[uVar15].super_RawBufferView.stride;
          pfVar1 = (float *)(pcVar19 + sVar24 * uVar8);
          auVar39._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
          auVar39._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
          auVar39._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
          auVar39._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
          uVar20 = movmskps((int)(sVar24 * uVar8),auVar39);
          if ((~(byte)uVar20 & 7) == 0) {
            psVar18 = &pBVar3[uVar15 + 1].super_RawBufferView.stride;
            do {
              lVar12 = sVar24 * uVar9;
              pfVar1 = (float *)(pcVar19 + lVar12);
              auVar64._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
              auVar64._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
              auVar64._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
              auVar64._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
              uVar20 = movmskps((int)lVar12,auVar64);
              if ((~(byte)uVar20 & 7) != 0) break;
              lVar12 = sVar24 * uVar10;
              pfVar1 = (float *)(pcVar19 + lVar12);
              auVar52._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
              auVar52._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
              auVar52._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
              auVar52._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
              uVar20 = movmskps((int)lVar12,auVar52);
              if ((~(byte)uVar20 & 7) != 0) break;
              pfVar1 = (float *)(pcVar19 + sVar24 * uVar13);
              auVar53._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
              auVar53._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
              auVar53._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
              auVar53._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
              uVar20 = movmskps((int)pcVar19,auVar53);
              if ((~(byte)uVar20 & 7) != 0) break;
              uVar15 = uVar15 + 1;
              bVar25 = (ulong)(long)(int)uVar17 < uVar15;
              if ((ulong)(long)(int)uVar17 < uVar15) goto LAB_00a59023;
              pcVar19 = ((RawBufferView *)(psVar18 + -2))->ptr_ofs;
              sVar24 = *psVar18;
              psVar18 = psVar18 + 7;
              pfVar1 = (float *)(pcVar19 + sVar24 * uVar8);
              auVar62._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
              auVar62._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
              auVar62._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
              auVar62._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
              uVar20 = movmskps((int)(sVar24 * uVar8),auVar62);
            } while ((~(byte)uVar20 & 7) == 0);
          }
          if (!bVar25) goto LAB_00a595a5;
        }
LAB_00a59023:
        fVar27 = (this->super_QuadMesh).super_Geometry.time_range.lower;
        fVar26 = (this->super_QuadMesh).super_Geometry.time_range.upper - fVar27;
        fVar36 = (fVar29 - fVar27) / fVar26;
        fVar26 = (fVar28 - fVar27) / fVar26;
        fVar27 = fVar43 * fVar26;
        fVar28 = floorf(fVar43 * fVar36);
        fVar29 = ceilf(fVar27);
        iVar7 = (int)fVar28;
        if (fVar28 <= 0.0) {
          fVar28 = 0.0;
        }
        if (iVar7 < 0) {
          iVar7 = -1;
        }
        uVar14 = (int)fVar43 + 1U;
        if ((int)fVar29 < (int)((int)fVar43 + 1U)) {
          uVar14 = (int)fVar29;
        }
        if (fVar43 <= fVar29) {
          fVar29 = fVar43;
        }
        lVar12 = (long)(int)fVar28;
        lVar16 = *(long *)&(this->super_QuadMesh).field_0x68 * uVar22;
        uVar15 = (ulong)*(uint *)(lVar21 + lVar16);
        uVar8 = (ulong)*(uint *)(lVar21 + 4 + lVar16);
        pBVar3 = (this->super_QuadMesh).vertices.items;
        pcVar19 = pBVar3[lVar12].super_RawBufferView.ptr_ofs;
        sVar24 = pBVar3[lVar12].super_RawBufferView.stride;
        uVar9 = (ulong)*(uint *)(lVar21 + 8 + lVar16);
        uVar10 = (ulong)*(uint *)(lVar21 + 0xc + lVar16);
        lVar21 = (long)(int)fVar29;
        pcVar4 = pBVar3[lVar21].super_RawBufferView.ptr_ofs;
        sVar5 = pBVar3[lVar21].super_RawBufferView.stride;
        auVar39 = minps(*(undefined1 (*) [16])(pcVar19 + sVar24 * uVar15),
                        *(undefined1 (*) [16])(pcVar19 + sVar24 * uVar8));
        auVar64 = minps(*(undefined1 (*) [16])(pcVar19 + sVar24 * uVar9),
                        *(undefined1 (*) [16])(pcVar19 + sVar24 * uVar10));
        auVar64 = minps(auVar39,auVar64);
        auVar52 = maxps(*(undefined1 (*) [16])(pcVar19 + sVar24 * uVar15),
                        *(undefined1 (*) [16])(pcVar19 + sVar24 * uVar8));
        auVar39 = maxps(*(undefined1 (*) [16])(pcVar19 + sVar24 * uVar9),
                        *(undefined1 (*) [16])(pcVar19 + sVar24 * uVar10));
        auVar53 = maxps(auVar52,auVar39);
        auVar39 = minps(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar15),
                        *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar8));
        auVar52 = minps(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar9),
                        *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar10));
        auVar39 = minps(auVar39,auVar52);
        auVar52 = maxps(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar15),
                        *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar8));
        auVar62 = maxps(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar9),
                        *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar10));
        auVar52 = maxps(auVar52,auVar62);
        fVar28 = fVar43 * fVar36 - fVar28;
        fVar31 = auVar39._0_4_;
        fVar37 = auVar64._0_4_;
        fVar57 = auVar52._0_4_;
        fVar59 = auVar52._4_4_;
        fVar60 = auVar52._8_4_;
        fVar51 = auVar53._0_4_;
        fVar55 = auVar53._4_4_;
        fVar56 = auVar53._8_4_;
        fVar41 = auVar64._4_4_;
        fVar42 = auVar64._8_4_;
        fVar34 = auVar39._4_4_;
        fVar35 = auVar39._8_4_;
        if (uVar14 - iVar7 == 1) {
          if (fVar28 <= 0.0) {
            fVar28 = 0.0;
          }
          fVar43 = 1.0 - fVar28;
          auVar38._4_4_ = fVar43 * fVar41 + fVar28 * fVar34;
          auVar38._0_4_ = fVar43 * fVar37 + fVar28 * fVar31;
          auVar45._0_4_ = fVar43 * fVar51 + fVar28 * fVar57;
          auVar45._4_4_ = fVar43 * fVar55 + fVar28 * fVar59;
          auVar45._8_4_ = fVar43 * fVar56 + fVar28 * fVar60;
          fVar29 = fVar29 - fVar27;
          if (fVar29 <= 0.0) {
            fVar29 = 0.0;
          }
          fVar27 = 1.0 - fVar29;
          auVar32._0_4_ = fVar31 * fVar27 + fVar37 * fVar29;
          auVar32._4_4_ = fVar34 * fVar27 + fVar41 * fVar29;
          auVar32._8_4_ = fVar35 * fVar27 + fVar42 * fVar29;
          auVar48._0_4_ = fVar27 * fVar57 + fVar29 * fVar51;
          auVar48._4_4_ = fVar27 * fVar59 + fVar29 * fVar55;
          auVar48._8_4_ = fVar27 * fVar60 + fVar29 * fVar56;
          auVar38._8_4_ = fVar43 * fVar42 + fVar28 * fVar35;
        }
        else {
          pcVar19 = pBVar3[lVar12 + 1].super_RawBufferView.ptr_ofs;
          sVar24 = pBVar3[lVar12 + 1].super_RawBufferView.stride;
          auVar62 = minps(*(undefined1 (*) [16])(pcVar19 + sVar24 * uVar15),
                          *(undefined1 (*) [16])(pcVar19 + sVar24 * uVar8));
          auVar65 = minps(*(undefined1 (*) [16])(pcVar19 + sVar24 * uVar9),
                          *(undefined1 (*) [16])(pcVar19 + sVar24 * uVar10));
          auVar63 = minps(auVar62,auVar65);
          auVar62 = maxps(*(undefined1 (*) [16])(pcVar19 + sVar24 * uVar15),
                          *(undefined1 (*) [16])(pcVar19 + sVar24 * uVar8));
          auVar65 = maxps(*(undefined1 (*) [16])(pcVar19 + sVar24 * uVar9),
                          *(undefined1 (*) [16])(pcVar19 + sVar24 * uVar10));
          auVar62 = maxps(auVar62,auVar65);
          pcVar19 = pBVar3[lVar21 + -1].super_RawBufferView.ptr_ofs;
          sVar24 = pBVar3[lVar21 + -1].super_RawBufferView.stride;
          auVar65 = minps(*(undefined1 (*) [16])(pcVar19 + sVar24 * uVar15),
                          *(undefined1 (*) [16])(pcVar19 + sVar24 * uVar8));
          auVar68 = minps(*(undefined1 (*) [16])(pcVar19 + sVar24 * uVar9),
                          *(undefined1 (*) [16])(pcVar19 + sVar24 * uVar10));
          auVar68 = minps(auVar65,auVar68);
          auVar65 = maxps(*(undefined1 (*) [16])(pcVar19 + sVar24 * uVar15),
                          *(undefined1 (*) [16])(pcVar19 + sVar24 * uVar8));
          auVar66 = maxps(*(undefined1 (*) [16])(pcVar19 + sVar24 * uVar9),
                          *(undefined1 (*) [16])(pcVar19 + sVar24 * uVar10));
          auVar65 = maxps(auVar65,auVar66);
          if (fVar28 <= 0.0) {
            fVar28 = 0.0;
          }
          fVar44 = 1.0 - fVar28;
          auVar38._0_4_ = fVar37 * fVar44 + auVar63._0_4_ * fVar28;
          auVar38._4_4_ = fVar41 * fVar44 + auVar63._4_4_ * fVar28;
          auVar38._8_4_ = fVar42 * fVar44 + auVar63._8_4_ * fVar28;
          auVar63._12_4_ = auVar64._12_4_ * fVar44 + auVar63._12_4_ * fVar28;
          auVar63._0_12_ = auVar38;
          auVar45._0_4_ = fVar44 * fVar51 + fVar28 * auVar62._0_4_;
          auVar45._4_4_ = fVar44 * fVar55 + fVar28 * auVar62._4_4_;
          auVar45._8_4_ = fVar44 * fVar56 + fVar28 * auVar62._8_4_;
          auVar66._12_4_ = fVar44 * auVar53._12_4_ + fVar28 * auVar62._12_4_;
          auVar66._0_12_ = auVar45;
          fVar29 = fVar29 - fVar27;
          if (fVar29 <= 0.0) {
            fVar29 = 0.0;
          }
          fVar28 = 1.0 - fVar29;
          auVar32._0_4_ = fVar31 * fVar28 + auVar68._0_4_ * fVar29;
          auVar32._4_4_ = fVar34 * fVar28 + auVar68._4_4_ * fVar29;
          auVar32._8_4_ = fVar35 * fVar28 + auVar68._8_4_ * fVar29;
          auVar68._12_4_ = auVar39._12_4_ * fVar28 + auVar68._12_4_ * fVar29;
          auVar68._0_12_ = auVar32;
          auVar48._0_4_ = fVar28 * fVar57 + fVar29 * auVar65._0_4_;
          auVar48._4_4_ = fVar28 * fVar59 + fVar29 * auVar65._4_4_;
          auVar48._8_4_ = fVar28 * fVar60 + fVar29 * auVar65._8_4_;
          auVar65._12_4_ = fVar28 * auVar52._12_4_ + fVar29 * auVar65._12_4_;
          auVar65._0_12_ = auVar48;
          uVar17 = iVar7 + 1;
          if ((int)uVar17 < (int)uVar14) {
            psVar18 = &pBVar3[uVar17].super_RawBufferView.stride;
            do {
              fVar28 = ((float)(int)uVar17 / fVar43 - fVar36) / (fVar26 - fVar36);
              fVar29 = 1.0 - fVar28;
              pcVar19 = ((RawBufferView *)(psVar18 + -2))->ptr_ofs;
              sVar24 = *psVar18;
              auVar39 = minps(*(undefined1 (*) [16])(pcVar19 + sVar24 * uVar15),
                              *(undefined1 (*) [16])(pcVar19 + sVar24 * uVar8));
              auVar64 = minps(*(undefined1 (*) [16])(pcVar19 + sVar24 * uVar9),
                              *(undefined1 (*) [16])(pcVar19 + sVar24 * uVar10));
              auVar39 = minps(auVar39,auVar64);
              auVar67._0_4_ = auVar39._0_4_ - (auVar63._0_4_ * fVar29 + auVar68._0_4_ * fVar28);
              auVar67._4_4_ = auVar39._4_4_ - (auVar63._4_4_ * fVar29 + auVar68._4_4_ * fVar28);
              auVar67._8_4_ = auVar39._8_4_ - (auVar63._8_4_ * fVar29 + auVar68._8_4_ * fVar28);
              auVar67._12_4_ = auVar39._12_4_ - (auVar63._12_4_ * fVar29 + auVar68._12_4_ * fVar28);
              auVar39 = maxps(*(undefined1 (*) [16])(pcVar19 + sVar24 * uVar15),
                              *(undefined1 (*) [16])(pcVar19 + sVar24 * uVar8));
              auVar64 = maxps(*(undefined1 (*) [16])(pcVar19 + sVar24 * uVar9),
                              *(undefined1 (*) [16])(pcVar19 + sVar24 * uVar10));
              auVar39 = maxps(auVar39,auVar64);
              auVar54._0_4_ = auVar39._0_4_ - (fVar29 * auVar66._0_4_ + fVar28 * auVar65._0_4_);
              auVar54._4_4_ = auVar39._4_4_ - (fVar29 * auVar66._4_4_ + fVar28 * auVar65._4_4_);
              auVar54._8_4_ = auVar39._8_4_ - (fVar29 * auVar66._8_4_ + fVar28 * auVar65._8_4_);
              auVar54._12_4_ = auVar39._12_4_ - (fVar29 * auVar66._12_4_ + fVar28 * auVar65._12_4_);
              auVar39 = minps(auVar67,ZEXT816(0));
              auVar38._0_4_ = auVar63._0_4_ + auVar39._0_4_;
              auVar38._4_4_ = auVar63._4_4_ + auVar39._4_4_;
              auVar38._8_4_ = auVar63._8_4_ + auVar39._8_4_;
              auVar63._12_4_ = auVar63._12_4_ + auVar39._12_4_;
              auVar63._0_12_ = auVar38;
              auVar32._0_4_ = auVar68._0_4_ + auVar39._0_4_;
              auVar32._4_4_ = auVar68._4_4_ + auVar39._4_4_;
              auVar32._8_4_ = auVar68._8_4_ + auVar39._8_4_;
              auVar68._12_4_ = auVar68._12_4_ + auVar39._12_4_;
              auVar68._0_12_ = auVar32;
              auVar39 = maxps(auVar54,ZEXT816(0));
              auVar45._0_4_ = auVar66._0_4_ + auVar39._0_4_;
              auVar45._4_4_ = auVar66._4_4_ + auVar39._4_4_;
              auVar45._8_4_ = auVar66._8_4_ + auVar39._8_4_;
              auVar66._12_4_ = auVar66._12_4_ + auVar39._12_4_;
              auVar66._0_12_ = auVar45;
              auVar48._0_4_ = auVar65._0_4_ + auVar39._0_4_;
              auVar48._4_4_ = auVar65._4_4_ + auVar39._4_4_;
              auVar48._8_4_ = auVar65._8_4_ + auVar39._8_4_;
              auVar65._12_4_ = auVar65._12_4_ + auVar39._12_4_;
              auVar65._0_12_ = auVar48;
              uVar17 = uVar17 + 1;
              psVar18 = psVar18 + 7;
            } while (uVar14 != uVar17);
          }
        }
        fVar43 = (float)((this->super_QuadMesh).super_Geometry.numTimeSteps - 1);
        uVar15 = (ulong)(uint)fVar43;
        aVar40.m128[3] = (float)geomID;
        aVar40._0_12_ = auVar38;
        aVar46.m128[3] = (float)uVar22;
        aVar46._0_12_ = auVar45;
        aVar33.m128[3] = fVar43;
        aVar33._0_12_ = auVar32;
        aVar49.m128[3] = fVar43;
        aVar49._0_12_ = auVar48;
        auVar30._0_4_ =
             auVar45._0_4_ * 0.5 + auVar48._0_4_ * 0.5 + auVar38._0_4_ * 0.5 + auVar32._0_4_ * 0.5;
        auVar30._4_4_ =
             auVar45._4_4_ * 0.5 + auVar48._4_4_ * 0.5 + auVar38._4_4_ * 0.5 + auVar32._4_4_ * 0.5;
        auVar30._8_4_ =
             auVar45._8_4_ * 0.5 + auVar48._8_4_ * 0.5 + auVar38._8_4_ * 0.5 + auVar32._8_4_ * 0.5;
        auVar30._12_4_ = (float)uVar22 * 0.5 + fVar43 * 0.5 + (float)geomID * 0.5 + fVar43 * 0.5;
        BVar2 = (this->super_QuadMesh).super_Geometry.time_range;
        local_c8.m128 = (__m128)minps(local_c8.m128,aVar40.m128);
        local_e0 = local_e0 + 1;
        sVar11 = sVar11 + uVar15;
        bVar25 = uVar23 < uVar15;
        if (uVar23 <= uVar15) {
          uVar23 = uVar15;
        }
        pPVar6 = prims->items;
        pPVar6[k].lbounds.bounds0.lower.field_0 = aVar40;
        local_d8.m128 = (__m128)maxps(local_d8.m128,aVar46.m128);
        pPVar6[k].lbounds.bounds0.upper.field_0 = aVar46;
        aVar61.m128 = (__m128)minps(aVar61.m128,aVar33.m128);
        pPVar6[k].lbounds.bounds1.lower.field_0 = aVar33;
        aVar58.m128 = (__m128)maxps(aVar58.m128,aVar49.m128);
        pPVar6[k].lbounds.bounds1.upper.field_0 = aVar49;
        pPVar6[k].time_range = BVar2;
        aVar50.m128 = (__m128)minps(aVar50.m128,auVar30);
        aVar47.m128 = (__m128)maxps(aVar47.m128,auVar30);
        fVar43 = BVar2.lower;
        if (fVar43 <= local_100) {
          local_100 = fVar43;
        }
        fVar28 = BVar2.upper;
        fVar29 = fVar28;
        if (fVar28 <= local_fc) {
          fVar29 = local_fc;
        }
        uVar14 = (int)((uint)bVar25 << 0x1f) >> 0x1f;
        uVar17 = (int)((uint)bVar25 << 0x1f) >> 0x1f;
        k = k + 1;
        local_b8.upper = (float)(~uVar17 & (uint)local_b8.upper | (uint)fVar28 & uVar17);
        local_b8.lower = (float)(~uVar14 & (uint)local_b8.lower | (uint)fVar43 & uVar14);
        local_fc = fVar29;
      }
LAB_00a595a5:
      uVar22 = uVar22 + 1;
    } while (uVar22 < r->_end);
    (__return_storage_ptr__->object_range)._end = local_e0;
  }
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = local_c8;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = local_d8;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar61;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar58;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar50;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar47;
  (__return_storage_ptr__->time_range).lower = local_100;
  (__return_storage_ptr__->time_range).upper = local_fc;
  __return_storage_ptr__->num_time_segments = sVar11;
  __return_storage_ptr__->max_num_time_segments = uVar23;
  __return_storage_ptr__->max_time_range = local_b8;
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(j, timeSegmentRange(t0t1))) continue;
          const PrimRefMB prim(linearBounds(j,t0t1),this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }